

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiStorage::SetVoidPtr(ImGuiStorage *this,ImGuiID key,void *val)

{
  ImGuiStoragePair *pIVar1;
  ImGuiStoragePair *pIVar2;
  void *in_RDX;
  ImGuiID in_ESI;
  ImVector<ImGuiStorage::ImGuiStoragePair> *in_RDI;
  ImGuiStoragePair *it;
  ImGuiStoragePair *it_00;
  ImVector<ImGuiStorage::ImGuiStoragePair> *in_stack_ffffffffffffffd0;
  
  pIVar1 = LowerBound(in_RDI,in_ESI);
  it_00 = pIVar1;
  pIVar2 = ImVector<ImGuiStorage::ImGuiStoragePair>::end(in_RDI);
  if ((it_00 == pIVar2) || (pIVar1->key != in_ESI)) {
    ImGuiStoragePair::ImGuiStoragePair((ImGuiStoragePair *)&stack0xffffffffffffffd0,in_ESI,in_RDX);
    ImVector<ImGuiStorage::ImGuiStoragePair>::insert
              (in_stack_ffffffffffffffd0,it_00,(ImGuiStoragePair *)in_RDI);
  }
  else {
    (pIVar1->field_1).val_p = in_RDX;
  }
  return;
}

Assistant:

void ImGuiStorage::SetVoidPtr(ImGuiID key, void* val)
{
    ImGuiStoragePair* it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
    {
        Data.insert(it, ImGuiStoragePair(key, val));
        return;
    }
    it->val_p = val;
}